

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O3

void __thiscall SM83::swap_dhl(SM83 *this)

{
  byte bVar1;
  string_view fmt;
  format_args args;
  ulong local_78 [2];
  ulong local_68;
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  
  local_78[0] = (ulong)(this->field_0).af;
  local_68 = (ulong)(this->field_1).bc;
  local_58 = (ulong)(this->field_2).de;
  local_48 = (ulong)(this->field_3).hl;
  local_38 = (ulong)this->sp;
  local_28 = (ulong)this->pc_at_opcode;
  fmt.size_ = 0x47;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  SWAP (HL)\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_78;
  args.desc_ = 0x222222;
  ::fmt::v11::vprint(fmt,args);
  bVar1 = Bus::Read8(this->bus,(this->field_3).hl,true);
  Bus::Write8(this->bus,(this->field_3).hl,bVar1 << 4 | bVar1 >> 4,true);
  (this->field_0).field_1.f = (bVar1 == 0) << 7 | (this->field_0).field_1.f & 0xf;
  return;
}

Assistant:

void SM83::swap_dhl() {
    LTRACE("SWAP (HL)");

    u8 value = bus.Read8(hl);
    u8 low = value & 0x0F;
    u8 high = (value & 0xF0) >> 4;

    u8 result = static_cast<u8>((low << 4) | high);

    bus.Write8(hl, result);

    SetZeroFlag(result == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(false);
    SetCarryFlag(false);
}